

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_scatter.cpp
# Opt level: O0

void duckdb::TemplatedScatter<float>
               (UnifiedVectorFormat *col,Vector *rows,SelectionVector *sel,idx_t count,
               idx_t col_offset,idx_t col_no,idx_t col_count)

{
  bool bVar1;
  idx_t idx_00;
  idx_t iVar2;
  ulong in_RCX;
  SelectionVector *in_RDX;
  UnifiedVectorFormat *in_RDI;
  long in_R8;
  uchar *row_1;
  idx_t col_idx_1;
  idx_t idx_1;
  idx_t i_1;
  ValidityBytes col_mask;
  float store_value;
  bool isnull;
  uchar *row;
  idx_t col_idx;
  idx_t idx;
  idx_t i;
  uchar **ptrs;
  float *data;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff48;
  TemplatedValidityMask<unsigned_char> *in_stack_ffffffffffffff50;
  ulong local_a0;
  float local_68;
  byte local_61;
  uchar *local_60;
  idx_t local_58;
  idx_t local_50;
  ulong local_48;
  uchar **local_40;
  float *local_38;
  long local_28;
  ulong local_20;
  SelectionVector *local_18;
  UnifiedVectorFormat *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_38 = UnifiedVectorFormat::GetData<float>(in_RDI);
  local_40 = FlatVector::GetData<unsigned_char*>((Vector *)0x1590301);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                    (&(local_8->validity).super_TemplatedValidityMask<unsigned_long>);
  if (bVar1) {
    for (local_a0 = 0; local_a0 < local_20; local_a0 = local_a0 + 1) {
      idx_00 = SelectionVector::get_index(local_18,local_a0);
      iVar2 = SelectionVector::get_index(local_8->sel,idx_00);
      Store<float>(local_38 + iVar2,local_40[idx_00] + local_28);
    }
  }
  else {
    for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
      local_50 = SelectionVector::get_index(local_18,local_48);
      local_58 = SelectionVector::get_index(local_8->sel,local_50);
      local_60 = local_40[local_50];
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff48,
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_61 = (bVar1 ^ 0xffU) & 1;
      if (local_61 == 0) {
        in_stack_ffffffffffffff44 = local_38[local_58];
      }
      else {
        in_stack_ffffffffffffff44 = NullValue<float>();
      }
      local_68 = in_stack_ffffffffffffff44;
      Store<float>(&local_68,local_60 + local_28);
      if ((local_61 & 1) != 0) {
        TemplatedValidityMask<unsigned_char>::TemplatedValidityMask
                  (in_stack_ffffffffffffff50,(uchar *)in_stack_ffffffffffffff48,
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        TemplatedValidityMask<unsigned_char>::SetInvalidUnsafe
                  (in_stack_ffffffffffffff50,(idx_t)in_stack_ffffffffffffff48);
        TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
                  ((TemplatedValidityMask<unsigned_char> *)0x1590446);
      }
    }
  }
  return;
}

Assistant:

static void TemplatedScatter(UnifiedVectorFormat &col, Vector &rows, const SelectionVector &sel, const idx_t count,
                             const idx_t col_offset, const idx_t col_no, const idx_t col_count) {
	auto data = UnifiedVectorFormat::GetData<T>(col);
	auto ptrs = FlatVector::GetData<data_ptr_t>(rows);

	if (!col.validity.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel.get_index(i);
			auto col_idx = col.sel->get_index(idx);
			auto row = ptrs[idx];

			auto isnull = !col.validity.RowIsValid(col_idx);
			T store_value = isnull ? NullValue<T>() : data[col_idx];
			Store<T>(store_value, row + col_offset);
			if (isnull) {
				ValidityBytes col_mask(ptrs[idx], col_count);
				col_mask.SetInvalidUnsafe(col_no);
			}
		}
	} else {
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel.get_index(i);
			auto col_idx = col.sel->get_index(idx);
			auto row = ptrs[idx];

			Store<T>(data[col_idx], row + col_offset);
		}
	}
}